

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>>::
findNode<QtGraphicsAnchorLayout::AnchorData*>
          (Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>> *this,
          AnchorData **key)

{
  byte bVar1;
  Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QtGraphicsAnchorLayout::AnchorData*>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)0x0;
  }
  else {
    pNVar2 = (Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)
             ((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }